

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBooleanClippingResult::IfcBooleanClippingResult
          (IfcBooleanClippingResult *this)

{
  IfcBooleanClippingResult *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcBooleanResult).field_0x80,"IfcBooleanClippingResult");
  IfcBooleanResult::IfcBooleanResult
            (&this->super_IfcBooleanResult,&PTR_construction_vtable_24__00f54698);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBooleanClippingResult,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBooleanClippingResult,_0UL> *)
             &(this->super_IfcBooleanResult).field_0x70,&PTR_construction_vtable_24__00f54710);
  (this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf545e0;
  *(undefined8 *)&(this->super_IfcBooleanResult).field_0x80 = 0xf54680;
  *(undefined8 *)
   &(this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf54608;
  *(undefined8 *)
   &(this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf54630;
  *(undefined8 *)&(this->super_IfcBooleanResult).field_0x70 = 0xf54658;
  return;
}

Assistant:

IfcBooleanClippingResult() : Object("IfcBooleanClippingResult") {}